

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O2

void __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_320UL,_16UL>_>
::unchecked_rehash(table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_320UL,_16UL>_>
                   *this,arrays_type *new_arrays_)

{
  group_type_pointer pgVar1;
  group_type_pointer pgVar2;
  group_type_pointer pgVar3;
  value_type_pointer ppVar4;
  uint uVar5;
  ushort uVar6;
  byte bVar7;
  char *pcVar8;
  size_t sVar9;
  undefined7 uVar10;
  group_type_pointer pgVar11;
  uint64_t uVar12;
  size_t sVar13;
  uint uVar14;
  group_type_pointer pgVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  value_type_pointer ppVar19;
  value_type_pointer sv;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  
  ppVar19 = (this->arrays).elements_;
  if (ppVar19 != (value_type_pointer)0x0) {
    sVar13 = (this->arrays).groups_size_mask;
    pgVar15 = (this->arrays).groups_;
    pgVar1 = pgVar15 + sVar13;
    pgVar11 = pgVar15 + sVar13 + 1;
    for (; pgVar15 != pgVar11; pgVar15 = pgVar15 + 1) {
      auVar20[0] = -(pgVar15->m[0].n == '\0');
      auVar20[1] = -(pgVar15->m[1].n == '\0');
      auVar20[2] = -(pgVar15->m[2].n == '\0');
      auVar20[3] = -(pgVar15->m[3].n == '\0');
      auVar20[4] = -(pgVar15->m[4].n == '\0');
      auVar20[5] = -(pgVar15->m[5].n == '\0');
      auVar20[6] = -(pgVar15->m[6].n == '\0');
      auVar20[7] = -(pgVar15->m[7].n == '\0');
      auVar20[8] = -(pgVar15->m[8].n == '\0');
      auVar20[9] = -(pgVar15->m[9].n == '\0');
      auVar20[10] = -(pgVar15->m[10].n == '\0');
      auVar20[0xb] = -(pgVar15->m[0xb].n == '\0');
      auVar20[0xc] = -(pgVar15->m[0xc].n == '\0');
      auVar20[0xd] = -(pgVar15->m[0xd].n == '\0');
      auVar20[0xe] = -(pgVar15->m[0xe].n == '\0');
      auVar20[0xf] = -(pgVar15->m[0xf].n == '\0');
      for (uVar14 = ((uint)(pgVar1 != pgVar15) << 0xe | 0x3fff) &
                    ~(uint)(ushort)((ushort)(SUB161(auVar20 >> 7,0) & 1) |
                                    (ushort)(SUB161(auVar20 >> 0xf,0) & 1) << 1 |
                                    (ushort)(SUB161(auVar20 >> 0x17,0) & 1) << 2 |
                                    (ushort)(SUB161(auVar20 >> 0x1f,0) & 1) << 3 |
                                    (ushort)(SUB161(auVar20 >> 0x27,0) & 1) << 4 |
                                    (ushort)(SUB161(auVar20 >> 0x2f,0) & 1) << 5 |
                                    (ushort)(SUB161(auVar20 >> 0x37,0) & 1) << 6 |
                                    (ushort)(SUB161(auVar20 >> 0x3f,0) & 1) << 7 |
                                    (ushort)(SUB161(auVar20 >> 0x47,0) & 1) << 8 |
                                    (ushort)(SUB161(auVar20 >> 0x4f,0) & 1) << 9 |
                                    (ushort)(SUB161(auVar20 >> 0x57,0) & 1) << 10 |
                                    (ushort)(SUB161(auVar20 >> 0x5f,0) & 1) << 0xb |
                                    (ushort)(SUB161(auVar20 >> 0x67,0) & 1) << 0xc |
                                    (ushort)(SUB161(auVar20 >> 0x6f,0) & 1) << 0xd |
                                    (ushort)(SUB161(auVar20 >> 0x77,0) & 1) << 0xe |
                                   (ushort)(auVar20[0xf] >> 7) << 0xf); uVar14 != 0;
          uVar14 = uVar14 - 1 & uVar14) {
        uVar5 = 0;
        if (uVar14 != 0) {
          for (; (uVar14 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
          }
        }
        sv = ppVar19 + uVar5;
        uVar12 = slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::
                 operator()((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                            this,&sv->first);
        uVar16 = uVar12 >> ((byte)new_arrays_->groups_size_index & 0x3f);
        pgVar3 = new_arrays_->groups_;
        uVar17 = new_arrays_->groups_size_mask;
        lVar18 = 1;
        while( true ) {
          pgVar2 = pgVar3 + uVar16;
          bVar7 = pgVar2->m[0xf].n;
          auVar21[0] = -(pgVar2->m[0].n == '\0');
          auVar21[1] = -(pgVar2->m[1].n == '\0');
          auVar21[2] = -(pgVar2->m[2].n == '\0');
          auVar21[3] = -(pgVar2->m[3].n == '\0');
          auVar21[4] = -(pgVar2->m[4].n == '\0');
          auVar21[5] = -(pgVar2->m[5].n == '\0');
          auVar21[6] = -(pgVar2->m[6].n == '\0');
          auVar21[7] = -(pgVar2->m[7].n == '\0');
          auVar21[8] = -(pgVar2->m[8].n == '\0');
          auVar21[9] = -(pgVar2->m[9].n == '\0');
          auVar21[10] = -(pgVar2->m[10].n == '\0');
          auVar21[0xb] = -(pgVar2->m[0xb].n == '\0');
          auVar21[0xc] = -(pgVar2->m[0xc].n == '\0');
          auVar21[0xd] = -(pgVar2->m[0xd].n == '\0');
          auVar21[0xe] = -(pgVar2->m[0xe].n == '\0');
          auVar21[0xf] = -(bVar7 == 0);
          uVar6 = (ushort)(SUB161(auVar21 >> 7,0) & 1) | (ushort)(SUB161(auVar21 >> 0xf,0) & 1) << 1
                  | (ushort)(SUB161(auVar21 >> 0x17,0) & 1) << 2 |
                  (ushort)(SUB161(auVar21 >> 0x1f,0) & 1) << 3 |
                  (ushort)(SUB161(auVar21 >> 0x27,0) & 1) << 4 |
                  (ushort)(SUB161(auVar21 >> 0x2f,0) & 1) << 5 |
                  (ushort)(SUB161(auVar21 >> 0x37,0) & 1) << 6 |
                  (ushort)(SUB161(auVar21 >> 0x3f,0) & 1) << 7 |
                  (ushort)(SUB161(auVar21 >> 0x47,0) & 1) << 8 |
                  (ushort)(SUB161(auVar21 >> 0x4f,0) & 1) << 9 |
                  (ushort)(SUB161(auVar21 >> 0x57,0) & 1) << 10 |
                  (ushort)(SUB161(auVar21 >> 0x5f,0) & 1) << 0xb |
                  (ushort)(SUB161(auVar21 >> 0x67,0) & 1) << 0xc |
                  (ushort)(SUB161(auVar21 >> 0x6f,0) & 1) << 0xd |
                  (ushort)(SUB161(auVar21 >> 0x77,0) & 1) << 0xe;
          if (uVar6 != 0) break;
          pgVar3[uVar16].m[0xf].n = bVar7 | '\x01' << ((byte)uVar12 & 7);
          uVar16 = uVar16 + lVar18 & uVar17;
          lVar18 = lVar18 + 1;
        }
        uVar5 = 0;
        if (uVar6 != 0) {
          for (; (uVar6 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
          }
        }
        uVar17 = (ulong)uVar5;
        ppVar4 = new_arrays_->elements_;
        pcVar8 = (sv->first)._M_str;
        ppVar4[uVar16 * 0xf + uVar17].first._M_len = (sv->first)._M_len;
        ppVar4[uVar16 * 0xf + uVar17].first._M_str = pcVar8;
        sVar13 = (sv->second).super_span<const_slang::parsing::Token,_18446744073709551615UL>.
                 _M_extent._M_extent_value;
        ppVar4[uVar16 * 0xf + uVar17].second.
        super_span<const_slang::parsing::Token,_18446744073709551615UL>._M_ptr =
             (sv->second).super_span<const_slang::parsing::Token,_18446744073709551615UL>._M_ptr;
        ppVar4[uVar16 * 0xf + uVar17].second.
        super_span<const_slang::parsing::Token,_18446744073709551615UL>._M_extent._M_extent_value =
             sVar13;
        uVar10 = *(undefined7 *)&(sv->second).field_0x11;
        ppVar4[uVar16 * 0xf + uVar17].second.isExpanded = (sv->second).isExpanded;
        *(undefined7 *)&ppVar4[uVar16 * 0xf + uVar17].second.field_0x11 = uVar10;
        pgVar3[uVar16].m[uVar17].n =
             group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)::word
             [(uVar12 & 0xff) * 4];
      }
      ppVar19 = ppVar19 + 0xf;
    }
  }
  delete_arrays(this,&this->arrays);
  sVar13 = new_arrays_->groups_size_index;
  sVar9 = new_arrays_->groups_size_mask;
  ppVar19 = new_arrays_->elements_;
  (this->arrays).groups_ = new_arrays_->groups_;
  (this->arrays).elements_ = ppVar19;
  (this->arrays).groups_size_index = sVar13;
  (this->arrays).groups_size_mask = sVar9;
  sVar13 = initial_max_load(this);
  (this->size_ctrl).ml = sVar13;
  return;
}

Assistant:

BOOST_NOINLINE void unchecked_rehash(arrays_type& new_arrays_) {
        std::size_t num_destroyed = 0;
        BOOST_TRY {
            for_all_elements([&, this](element_type* p) {
                nosize_transfer_element(p, new_arrays_, num_destroyed);
            });
        }